

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

ON__UINT64 __thiscall
ON_SerialNumberMap::GetElements
          (ON_SerialNumberMap *this,ON__UINT64 sn0,ON__UINT64 sn1,ON__UINT64 max_count,
          ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *elements)

{
  ON_SN_BLOCK **ppOVar1;
  ON_SerialNumberMapPrivate *pOVar2;
  SN_ELEMENT *pSVar3;
  ulong uVar4;
  ulong uVar5;
  SN_ELEMENT *x;
  ulong uVar6;
  ON_SN_BLOCK *pOVar7;
  ON__UINT64 *pOVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  if (max_count == 0 || sn1 < sn0) {
    return 0;
  }
  if (this->m_sn_count <= this->m_sn_purged) {
    return 0;
  }
  lVar14 = (long)*(int *)(elements + 0x10);
  if (sn0 + 3 <= sn1) {
    if (*(uint *)(elements + 0x14) < (uint)(lVar14 + 3U)) {
      ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::SetCapacity(elements,lVar14 + 3U);
    }
    do {
      pSVar3 = FindElementHelper(this,sn0);
      if ((pSVar3 != (SN_ELEMENT *)0x0) && (pSVar3->m_sn_active != '\0')) {
        ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,pSVar3);
      }
      sn0 = sn0 + 1;
    } while (sn0 <= sn1);
    return *(int *)(elements + 0x10) - lVar14;
  }
  uVar9 = this->m_snblk_list_count;
  if (uVar9 == 0) {
    uVar16 = 0;
    uVar5 = 0;
  }
  else {
    ppOVar1 = this->m_snblk_list;
    uVar5 = 0;
    do {
      pOVar7 = ppOVar1[uVar5];
      if (sn0 <= pOVar7->m_sn1) {
        if (sn1 < pOVar7->m_sn0) goto LAB_004cfa93;
        pSVar3 = (SN_ELEMENT *)0x0;
        goto LAB_004cfa9b;
      }
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
    uVar16 = 0;
    uVar5 = uVar9;
  }
LAB_004cfafd:
  pSVar3 = (SN_ELEMENT *)0x0;
  uVar12 = 0;
  goto LAB_004cfb00;
  while( true ) {
    pOVar7 = ppOVar1[uVar5];
    uVar16 = 0;
    uVar12 = 0;
    if (sn1 < pOVar7->m_sn0) break;
LAB_004cfa9b:
    uVar16 = (ulong)pOVar7->m_count;
    pOVar8 = &pOVar7->m_sn[1].m_sn;
    while( true ) {
      uVar4 = pOVar8[-7];
      if ((sn0 <= uVar4) && ((char)pOVar8[-6] != '\0')) {
        if (sn1 < uVar4) goto LAB_004cfafd;
        pOVar7 = ppOVar1[uVar5];
        uVar13 = pOVar7->m_count - pOVar7->m_purged;
        uVar15 = (ulong)uVar13;
        if (uVar13 == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = pOVar7->m_sn0;
          if (pOVar7->m_sn0 <= uVar4) {
            uVar12 = uVar4;
          }
          uVar6 = pOVar7->m_sn1;
          if (sn1 <= pOVar7->m_sn1) {
            uVar6 = sn1;
          }
          uVar12 = (uVar6 - uVar12) + 1;
          if (uVar15 <= uVar12) {
            uVar12 = uVar15;
          }
        }
        pSVar3 = (SN_ELEMENT *)(pOVar8 + -9);
        if (uVar9 <= uVar5 + 1) goto LAB_004cfb00;
        uVar6 = uVar5;
        goto LAB_004cfcef;
      }
      if (uVar16 == 1) break;
      uVar16 = uVar16 - 1;
      uVar4 = *pOVar8;
      pOVar8 = pOVar8 + 7;
      if (sn1 < uVar4) goto LAB_004cfafd;
    }
    uVar5 = uVar5 + 1;
    if (uVar9 <= uVar5) goto LAB_004cfa93;
  }
  goto LAB_004cfb00;
  while( true ) {
    if (pOVar7->m_count == pOVar7->m_purged) {
      uVar11 = 0;
    }
    else {
      uVar11 = pOVar7->m_sn0;
      if (pOVar7->m_sn0 <= uVar4) {
        uVar11 = uVar4;
      }
      uVar10 = pOVar7->m_sn1;
      if (sn1 <= pOVar7->m_sn1) {
        uVar10 = sn1;
      }
      uVar11 = (uVar10 - uVar11) + 1;
      if (uVar15 <= uVar11) {
        uVar11 = uVar15;
      }
    }
    uVar12 = uVar12 + uVar11;
    uVar6 = uVar6 + 1;
    if (uVar9 - 1 == uVar6) break;
LAB_004cfcef:
    if (sn1 < ppOVar1[uVar6 + 1]->m_sn0) break;
  }
LAB_004cfb00:
  pOVar7 = this->m_sn_block0;
  uVar9 = (ulong)pOVar7->m_purged;
  if ((((pOVar7->m_purged < pOVar7->m_count) && (pOVar7->m_sn0 <= sn1)) && (sn0 <= pOVar7->m_sn1))
     && (pOVar7->m_sorted == 0)) {
    if (uVar9 != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      this->m_sn_count = this->m_sn_count - uVar9;
      this->m_sn_purged = this->m_sn_purged - uVar9;
      ON_SN_BLOCK::CullBlockHelper(pOVar7);
      if (this->m_snblk_list_count == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = this->m_snblk_list[this->m_snblk_list_count - 1]->m_sn1;
      }
      pOVar7 = this->m_sn_block0;
      uVar4 = pOVar7->m_sn1;
      if (pOVar7->m_sn1 < uVar9) {
        uVar4 = uVar9;
      }
      pOVar2 = this->m_private;
      pOVar2->m_maxsn = uVar4;
      if (uVar4 < 0xffffffff) {
        pOVar2->m_lower_maxsn = uVar4;
      }
    }
    if (pOVar7->m_count != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      ON_SN_BLOCK::SortBlockHelper(pOVar7);
      pOVar7 = this->m_sn_block0;
      uVar9 = pOVar7->m_sn0;
      x = (SN_ELEMENT *)0x0;
      if (sn1 < uVar9) {
        uVar15 = 0;
        goto LAB_004cfb31;
      }
      uVar4 = pOVar7->m_sn1;
      if (sn0 <= uVar4) {
        uVar13 = pOVar7->m_count;
        uVar15 = (ulong)uVar13;
        if (uVar13 == pOVar7->m_purged) {
          uVar9 = 0;
        }
        else {
          uVar6 = pOVar7->m_sn[0].m_sn;
          uVar11 = (ulong)(uVar13 - pOVar7->m_purged);
          if (uVar6 < uVar9) {
            uVar6 = uVar9;
          }
          if (sn1 <= uVar4) {
            uVar4 = sn1;
          }
          uVar9 = (uVar4 - uVar6) + 1;
          if (uVar11 <= uVar9) {
            uVar9 = uVar11;
          }
        }
        x = pOVar7->m_sn;
        uVar12 = uVar12 + uVar9;
        goto LAB_004cfb31;
      }
    }
  }
  x = (SN_ELEMENT *)0x0;
  uVar15 = 0;
LAB_004cfb31:
  uVar9 = (sn1 - sn0) + 1;
  if (uVar12 < uVar9) {
    uVar9 = uVar12;
  }
  if (0x1fff < uVar9) {
    uVar9 = 0x2000;
  }
  if (*(uint *)(elements + 0x14) < (uint)((long)*(int *)(elements + 0x10) + uVar9)) {
    ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::SetCapacity
              (elements,(long)*(int *)(elements + 0x10) + uVar9);
  }
LAB_004cfc06:
  while( true ) {
    if (x == (SN_ELEMENT *)0x0 && pSVar3 == (SN_ELEMENT *)0x0) {
      return *(int *)(elements + 0x10) - lVar14;
    }
    if ((x == (SN_ELEMENT *)0x0) || ((pSVar3 != (SN_ELEMENT *)0x0 && (pSVar3->m_sn <= x->m_sn))))
    break;
    if (x->m_sn_active != '\0') {
      ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,x);
    }
    uVar15 = uVar15 - 1;
    if (uVar15 == 0) {
      uVar15 = 0;
LAB_004cfbf7:
      x = (SN_ELEMENT *)0x0;
    }
    else {
      if (sn1 < x[1].m_sn) goto LAB_004cfbf7;
      x = x + 1;
    }
  }
  if (pSVar3->m_sn_active != '\0') {
    ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,pSVar3);
  }
  uVar16 = uVar16 - 1;
  if (uVar16 == 0) {
    uVar9 = uVar5 + 1;
    if ((uVar9 < this->m_snblk_list_count) &&
       (pOVar7 = this->m_snblk_list[uVar5 + 1], sn1 <= pOVar7->m_sn0)) {
      uVar16 = (ulong)pOVar7->m_count;
      pSVar3 = pOVar7->m_sn;
      uVar5 = uVar9;
      goto LAB_004cfc06;
    }
    uVar16 = 0;
  }
  else {
    uVar9 = uVar5;
    if (pSVar3[1].m_sn <= sn1) {
      pSVar3 = pSVar3 + 1;
      goto LAB_004cfc06;
    }
  }
  pSVar3 = (SN_ELEMENT *)0x0;
  uVar5 = uVar9;
  goto LAB_004cfc06;
LAB_004cfa93:
  uVar16 = 0;
  goto LAB_004cfafd;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::GetElements(
  ON__UINT64 sn0,
  ON__UINT64 sn1, 
  ON__UINT64 max_count,
  ON_SimpleArray<SN_ELEMENT>& elements
  ) const
{
  ON__UINT64 i,j,k,c;
  const SN_ELEMENT *ei, *ek;

  const int elements_count0 = elements.Count();

  if ( sn1 < sn0 || max_count <= 0 || m_sn_count <= m_sn_purged )
    return 0;

  if ( sn0+3 <= sn1 )
  {
    elements.Reserve(elements_count0+3);
    while ( sn0 <= sn1 )
    {
      ei = const_cast<ON_SerialNumberMap*>(this)->FindElementHelper(sn0++);
      if ( ei && ei->m_sn_active )
        elements.Append(*ei);
    }
    return (elements.Count() - elements_count0); 
  }

  ek = 0;
  k = 0;
  for ( j = 0; j < m_snblk_list_count; j++ )
  {
    if ( m_snblk_list[j]->m_sn1 < sn0 )
      continue;
    if ( sn1 < m_snblk_list[j]->m_sn0 )
      break;

    k = m_snblk_list[j]->m_count; // always > 0
    ek = &m_snblk_list[j]->m_sn[0];
    while ( ek->m_sn < sn0 || !ek->m_sn_active )
    {
      if ( --k )
      {
        if ((++ek)->m_sn > sn1)
        {
          ek = 0;
          break;
        }
      }
      else if ( ++j < m_snblk_list_count && m_snblk_list[j]->m_sn0 <= sn1 )
      {
        k = m_snblk_list[j]->m_count; // always > 0
        ek = &m_snblk_list[j]->m_sn[0];
      }
      else
      {
        ek = 0;
        break;
      }
    }
    if ( ek && ek->m_sn > sn1 )
      ek = 0;
    break;
  }

  // set c = estimate of number of items in m_snblk_list[]
  if ( ek )
  {
    c = m_snblk_list[j]->ActiveElementEstimate(ek->m_sn,sn1);
    for ( i = j+1; i < m_snblk_list_count && m_snblk_list[i]->m_sn0 <= sn1; i++ )
    {
      c += m_snblk_list[j]->ActiveElementEstimate(ek->m_sn,sn1);
    }
  }
  else
    c = 0;

  // determine where to begin searching in m_sn_block0
  i = 0;
  ei = 0;
  if (    m_sn_block0.m_count > m_sn_block0.m_purged
       && sn1 >= m_sn_block0.m_sn0
       && sn0 <= m_sn_block0.m_sn1
       && !m_sn_block0.m_sorted
     )
  {
    if ( !m_sn_block0.m_sorted )
    {
      if ( m_sn_block0.m_purged > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
        const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
        const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
        const_cast<ON_SerialNumberMap*>(this)->UpdateMaxSNHelper();
      }
      if ( m_sn_block0.m_count > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();
        if ( sn1 >= m_sn_block0.m_sn0 && sn0 <= m_sn_block0.m_sn1 )
        {
          i = m_sn_block0.m_count;
          ei = &m_sn_block0.m_sn[0];
        }
      }
    }
    else
    {
      i = m_sn_block0.m_count;
      ei = &m_sn_block0.m_sn[0];
      while ( ei->m_sn < sn0 || !ei->m_sn_active )
      {
        if ( --i )
          ei++;
        else
        {
          ei = 0;
          break;
        }
      }
      if ( ei && ei->m_sn > sn1 )
      {
        ei = 0;
      }
    }
  }

  // adjust c = estimate of number of items in m_snblk_list[]
  if ( ei )
    c += m_sn_block0.ActiveElementEstimate(ei->m_sn,sn1);
  if (c > (sn1-sn0+1) )
    c = (sn1-sn0+1);
  if ( c > 2*4096 )
    c = 2*4096;

  // reserve room for elements so we don't thrash memory
  // while growing a large dynamic array.
  elements.Reserve(elements.Count()+((int)c));

  // Add appropriate elements to elements[] array.
  while (ei || ek)
  {
    if (ei && (!ek || ei->m_sn < ek->m_sn) )
    {
      if ( ei->m_sn_active )
        elements.Append(*ei);
      if ( --i )
      {
        if ( (++ei)->m_sn > sn1 )
        {
          ei = 0;
        }
      }
      else
      {
        ei = 0;
      }
    }
    else 
    {
      if ( ek->m_sn_active )
        elements.Append(*ek);
      if ( --k )
      {
        if ( (++ek)->m_sn > sn1 )
        {
          ek = 0;
        }
      }
      else if (++j < m_snblk_list_count && sn1 <= m_snblk_list[j]->m_sn0 )
      {
        k = m_snblk_list[j]->m_count; // always > 0
        ek = &m_snblk_list[j]->m_sn[0];
      }
      else 
      {
        ek = 0;
      }
    }
  }
  
  return (elements.Count() - elements_count0);
}